

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::MetafTime> * metaf::MetafTime::fromStringDDHH(string *s)

{
  bool bVar1;
  long lVar2;
  MetafTime *in_RDI;
  size_t in_stack_00000008;
  MetafTime metafTime;
  optional<unsigned_int> hour;
  optional<unsigned_int> day;
  MetafTime *this;
  
  this = in_RDI;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 4) {
    strToUint((string *)metafTime._8_8_,
              (size_t)metafTime.dayValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>,in_stack_00000008);
    strToUint((string *)metafTime._8_8_,
              (size_t)metafTime.dayValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>,in_stack_00000008);
    bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x23ff52);
    if ((bVar1) &&
       (bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x23ff62), bVar1))
    {
      MetafTime(this);
      std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x23ffa8);
      std::optional<metaf::MetafTime>::optional<metaf::MetafTime,_true>
                ((optional<metaf::MetafTime> *)this,in_RDI);
    }
    else {
      (((_Optional_base<metaf::MetafTime,_true,_true> *)&in_RDI->dayValue)->_M_payload).
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)0;
      in_RDI->hourValue = 0;
      in_RDI->minuteValue = 0;
      in_RDI[1].dayValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0;
    }
  }
  else {
    (((_Optional_base<metaf::MetafTime,_true,_true> *)&in_RDI->dayValue)->_M_payload).
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)0;
    in_RDI->hourValue = 0;
    in_RDI->minuteValue = 0;
    in_RDI[1].dayValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0;
  }
  return (optional<metaf::MetafTime> *)this;
}

Assistant:

std::optional<MetafTime> MetafTime::fromStringDDHH(const std::string & s) {
	//static const std::regex rgx ("(\\d\\d)(\\d\\d)");
	static const std::optional<MetafTime> error;
	if (s.length() != 4) return error;
	const auto day = strToUint(s, 0, 2);
	const auto hour = strToUint(s, 2, 2);
	if (!day.has_value() || !hour.has_value()) return error;
	MetafTime metafTime;
	metafTime.dayValue = day;
	metafTime.hourValue = *hour;
	return metafTime;
}